

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O0

uint8_t * AACCodec::findAacFrame(uint8_t *buffer,uint8_t *end)

{
  byte *local_28;
  uint8_t *curBuf;
  uint8_t *end_local;
  uint8_t *buffer_local;
  
  local_28 = buffer;
  while( true ) {
    while( true ) {
      if (end <= local_28) {
        return (uint8_t *)0x0;
      }
      if (0xef < *local_28) break;
      local_28 = local_28 + 2;
    }
    if (((*local_28 == 0xff) && (local_28 < end + -1)) && ((local_28[1] & 0xf6) == 0xf0)) break;
    if ((((*local_28 & 0xf6) == 0xf0) && (buffer < local_28)) && (local_28[-1] == 0xff)) {
      return local_28 + -1;
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

uint8_t* AACCodec::findAacFrame(uint8_t* buffer, const uint8_t* end)
{
    uint8_t* curBuf = buffer;
    while (curBuf < end)
    {
        if (*curBuf < 0xf0)
            curBuf += 2;
        else if (*curBuf == 0xff && curBuf < end - 1 && (curBuf[1] & 0xf6) == 0xf0)
            return curBuf;
        else if ((*curBuf & 0xf6) == 0xf0 && curBuf > buffer && curBuf[-1] == 0xff)
            return curBuf - 1;
        else
            curBuf++;
    }
    return nullptr;
}